

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  bool bVar2;
  int iVar3;
  Type value;
  UnknownField *pUVar4;
  string *data;
  UnknownFieldSet *unknown_fields_00;
  LogMessage *pLVar5;
  byte bVar6;
  byte unaff_BPL;
  int iVar7;
  int iVar8;
  UnknownFieldSet intermediate_unknown_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    iVar8 = 0;
    do {
      iVar3 = iVar8;
      pvVar1 = unknown_fields->fields_;
      iVar7 = 0;
      if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        iVar7 = (int)((ulong)((long)(pvVar1->
                                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar1->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      if (iVar7 <= iVar3) goto LAB_002ec8f6;
      pUVar4 = UnknownFieldSet::field(unknown_fields,iVar3);
      iVar8 = iVar3 + 1;
    } while (pUVar4->number_ != *(uint32 *)(innermost_field + 0x38));
    std::operator+(&local_50,"Option \"",debug_msg_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &intermediate_unknown_fields,&local_50,"\" was already set.");
    unaff_BPL = AddNameError(this,(string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&local_50);
LAB_002ec8f6:
    bVar6 = iVar7 <= iVar3 | unaff_BPL;
LAB_002ec950:
    return (bool)(bVar6 & 1);
  }
  iVar8 = 0;
  do {
    pvVar1 = unknown_fields->fields_;
    iVar3 = 0;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar3 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    bVar6 = iVar3 <= iVar8;
    if (iVar3 <= iVar8) goto LAB_002ec950;
    pUVar4 = UnknownFieldSet::field(unknown_fields,iVar8);
    if (pUVar4->number_ == *(uint32 *)(*intermediate_fields_iter._M_current + 0x38)) {
      pUVar4 = UnknownFieldSet::field(unknown_fields,iVar8);
      value = FieldDescriptor::type(*intermediate_fields_iter._M_current);
      if (value == TYPE_GROUP) {
        if (pUVar4->type_ == 4) {
          unknown_fields_00 = UnknownField::group(pUVar4);
          bVar2 = ExamineIfOptionIsSet
                            (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                             intermediate_fields_end,innermost_field,debug_msg_name,
                             unknown_fields_00);
          if (!bVar2) goto LAB_002ec950;
        }
      }
      else {
        if (value != TYPE_MESSAGE) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&intermediate_unknown_fields,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1874);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)&intermediate_unknown_fields,
                              "Invalid wire type for CPPTYPE_MESSAGE: ");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,value);
          internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)&intermediate_unknown_fields);
LAB_002ec94e:
          bVar6 = 0;
          goto LAB_002ec950;
        }
        if (pUVar4->type_ == 3) {
          intermediate_unknown_fields.fields_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)0x0;
          data = UnknownField::length_delimited_abi_cxx11_(pUVar4);
          bVar2 = UnknownFieldSet::ParseFromString(&intermediate_unknown_fields,data);
          if (bVar2) {
            bVar2 = ExamineIfOptionIsSet
                              (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,debug_msg_name,
                               &intermediate_unknown_fields);
            if (!bVar2) {
              UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
              goto LAB_002ec94e;
            }
          }
          UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}